

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void TestLexicalAnalysis(char *test_file_name)

{
  int iVar1;
  int iVar2;
  compile_errcode cVar3;
  ostream *poVar4;
  Symbol symbol;
  LexicalAnalysis lexical_analysis;
  undefined1 local_488 [16];
  _Alloc_hider local_478;
  size_type local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  int local_458;
  int local_454;
  LexicalAnalysis local_450;
  
  LexicalAnalysis::LexicalAnalysis(&local_450,test_file_name);
  if (local_450.fp_in == (FILE *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"bad file");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    local_478._M_p = (pointer)&local_468;
    local_470 = 0;
    local_468._M_local_buf[0] = '\0';
    do {
      while( true ) {
        cVar3 = LexicalAnalysis::GetSym(&local_450,(Symbol *)local_488);
        iVar2 = local_454;
        iVar1 = local_458;
        if (cVar3 == 0) break;
        poVar4 = std::operator<<((ostream *)&std::cerr,"errcode:");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,cVar3);
        poVar4 = std::operator<<(poVar4," in line ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar1);
        poVar4 = std::operator<<(poVar4," in character ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,iVar2);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    } while (local_488._0_4_ != EOF_SYM);
    std::__cxx11::string::~string((string *)&local_478);
  }
  LexicalAnalysis::~LexicalAnalysis(&local_450);
  return;
}

Assistant:

void TestLexicalAnalysis(const char* test_file_name) {
    int ret = COMPILE_OK;
    LexicalAnalysis lexical_analysis(test_file_name);
    if (!lexical_analysis.CheckFile()) {
        std::cerr << "bad file" << endl;
        return;
    }
    Symbol symbol;
    bool log_flag = false;
    while (true) {
        ret = lexical_analysis.GetSym(symbol);
        if (ret == COMPILE_OK) {
            SymbolName name = symbol.GetName();
            if (name == EOF_SYM) {
                break;
            } else if (!log_flag) {
                continue;
            } else if (name == IDENTIFIER_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<std::string>() << endl;
            } else if (name == STRING_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<std::string>() << endl;
            } else if (name == CHARACTER_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<char>() << endl;
            } else if (name == INTERGER_SYM) {
                cout << symbol_name_string[name] << " " << symbol.GetValue<int>() << endl;
            } else {
                cout << symbol_name_string[name] << endl;
            }
        } else {
            int line_number = symbol.GetLine();
            int character_number = symbol.GetCharacter();
            std::cerr << "errcode:" << ret << " in line " << line_number << " in character " << character_number << endl;
        }
    }
}